

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_GPSTIME11_v2::read
          (LASreadItemCompressed_GPSTIME11_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  U32 UVar1;
  I32 IVar2;
  undefined4 in_register_00000034;
  U64I64F64 *pUVar3;
  int local_28;
  I32 gpstime_diff;
  I32 multi;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_GPSTIME11_v2 *this_local;
  
  pUVar3 = (U64I64F64 *)CONCAT44(in_register_00000034,__fd);
  if (this->last_gpstime_diff[this->last] == 0) {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_0diff);
    if (UVar1 == 1) {
      IVar2 = IntegerCompressor::decompress(this->ic_gpstime,0,0);
      this->last_gpstime_diff[this->last] = IVar2;
      this->last_gpstime[this->last].u64 =
           (long)this->last_gpstime_diff[this->last] + this->last_gpstime[this->last].u64;
      this->multi_extreme_counter[this->last] = 0;
    }
    else if (UVar1 == 2) {
      this->next = this->next + 1 & 3;
      IVar2 = IntegerCompressor::decompress
                        (this->ic_gpstime,(I32)((ulong)this->last_gpstime[this->last].i64 >> 0x20),8
                        );
      this->last_gpstime[this->next] = (U64I64F64)(long)IVar2;
      this->last_gpstime[this->next].u64 = this->last_gpstime[this->next].u64 << 0x20;
      UVar1 = ArithmeticDecoder::readInt(this->dec);
      this->last_gpstime[this->next].u64 = (ulong)UVar1 | this->last_gpstime[this->next].u64;
      this->last = this->next;
      this->last_gpstime_diff[this->last] = 0;
      this->multi_extreme_counter[this->last] = 0;
    }
    else if (2 < (int)UVar1) {
      this->last = (this->last + UVar1) - 2 & 3;
      (**(this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem)(this,pUVar3,__buf)
      ;
    }
  }
  else {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_multi);
    if (UVar1 == 1) {
      IVar2 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff[this->last],1);
      this->last_gpstime[this->last].u64 = (long)IVar2 + this->last_gpstime[this->last].u64;
      this->multi_extreme_counter[this->last] = 0;
    }
    else if ((int)UVar1 < 0x1ff) {
      if (UVar1 == 0) {
        local_28 = IntegerCompressor::decompress(this->ic_gpstime,0,7);
        this->multi_extreme_counter[this->last] = this->multi_extreme_counter[this->last] + 1;
        if (3 < this->multi_extreme_counter[this->last]) {
          this->last_gpstime_diff[this->last] = local_28;
          this->multi_extreme_counter[this->last] = 0;
        }
      }
      else if ((int)UVar1 < 500) {
        if ((int)UVar1 < 10) {
          local_28 = IntegerCompressor::decompress
                               (this->ic_gpstime,UVar1 * this->last_gpstime_diff[this->last],2);
        }
        else {
          local_28 = IntegerCompressor::decompress
                               (this->ic_gpstime,UVar1 * this->last_gpstime_diff[this->last],3);
        }
      }
      else if (UVar1 == 500) {
        local_28 = IntegerCompressor::decompress
                             (this->ic_gpstime,this->last_gpstime_diff[this->last] * 500,4);
        this->multi_extreme_counter[this->last] = this->multi_extreme_counter[this->last] + 1;
        if (3 < this->multi_extreme_counter[this->last]) {
          this->last_gpstime_diff[this->last] = local_28;
          this->multi_extreme_counter[this->last] = 0;
        }
      }
      else if ((int)(500 - UVar1) < -9) {
        local_28 = IntegerCompressor::decompress
                             (this->ic_gpstime,this->last_gpstime_diff[this->last] * -10,6);
        this->multi_extreme_counter[this->last] = this->multi_extreme_counter[this->last] + 1;
        if (3 < this->multi_extreme_counter[this->last]) {
          this->last_gpstime_diff[this->last] = local_28;
          this->multi_extreme_counter[this->last] = 0;
        }
      }
      else {
        local_28 = IntegerCompressor::decompress
                             (this->ic_gpstime,(500 - UVar1) * this->last_gpstime_diff[this->last],5
                             );
      }
      this->last_gpstime[this->last].u64 = (long)local_28 + this->last_gpstime[this->last].u64;
    }
    else if (UVar1 == 0x200) {
      this->next = this->next + 1 & 3;
      IVar2 = IntegerCompressor::decompress
                        (this->ic_gpstime,(I32)((ulong)this->last_gpstime[this->last].i64 >> 0x20),8
                        );
      this->last_gpstime[this->next] = (U64I64F64)(long)IVar2;
      this->last_gpstime[this->next].u64 = this->last_gpstime[this->next].u64 << 0x20;
      UVar1 = ArithmeticDecoder::readInt(this->dec);
      this->last_gpstime[this->next].u64 = (ulong)UVar1 | this->last_gpstime[this->next].u64;
      this->last = this->next;
      this->last_gpstime_diff[this->last] = 0;
      this->multi_extreme_counter[this->last] = 0;
    }
    else if (0x1ff < (int)UVar1) {
      this->last = (this->last + UVar1) - 0x200 & 3;
      (**(this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem)(this,pUVar3,__buf)
      ;
    }
  }
  *pUVar3 = this->last_gpstime[this->last];
  return (ssize_t)pUVar3;
}

Assistant:

inline void LASreadItemCompressed_GPSTIME11_v2::read(U8* item, U32& context)
{
  I32 multi;
  if (last_gpstime_diff[last] == 0) // if the last integer difference was zero
  {
    multi = dec->decodeSymbol(m_gpstime_0diff);
    if (multi == 1) // the difference can be represented with 32 bits
    {
      last_gpstime_diff[last] = ic_gpstime->decompress(0, 0);
      last_gpstime[last].i64 += last_gpstime_diff[last];
      multi_extreme_counter[last] = 0; 
    }
    else if (multi == 2) // the difference is huge
    {
      next = (next+1)&3;
      last_gpstime[next].u64 = ic_gpstime->decompress((I32)(last_gpstime[last].u64 >> 32), 8);
      last_gpstime[next].u64 = last_gpstime[next].u64 << 32;
      last_gpstime[next].u64 |= dec->readInt();
      last = next;
      last_gpstime_diff[last] = 0;
      multi_extreme_counter[last] = 0; 
    }
    else if (multi > 2) // we switch to another sequence
    {
      last = (last+multi-2)&3;
      read(item, context);
    }
  }
  else
  {
    multi = dec->decodeSymbol(m_gpstime_multi);
    if (multi == 1)
    {
      last_gpstime[last].i64 += ic_gpstime->decompress(last_gpstime_diff[last], 1);;
      multi_extreme_counter[last] = 0;
    }
    else if (multi < LASZIP_GPSTIME_MULTI_UNCHANGED)
    {
      I32 gpstime_diff;
      if (multi == 0)
      {
        gpstime_diff = ic_gpstime->decompress(0, 7);
        multi_extreme_counter[last]++;
        if (multi_extreme_counter[last] > 3)
        {
          last_gpstime_diff[last] = gpstime_diff;
          multi_extreme_counter[last] = 0;
        }
      }
      else if (multi < LASZIP_GPSTIME_MULTI)
      {
        if (multi < 10)
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 2);
        else
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 3);
      }
      else if (multi == LASZIP_GPSTIME_MULTI)
      {
        gpstime_diff = ic_gpstime->decompress(LASZIP_GPSTIME_MULTI*last_gpstime_diff[last], 4);
        multi_extreme_counter[last]++;
        if (multi_extreme_counter[last] > 3)
        {
          last_gpstime_diff[last] = gpstime_diff;
          multi_extreme_counter[last] = 0;
        }
      }
      else
      {
        multi = LASZIP_GPSTIME_MULTI - multi;
        if (multi > LASZIP_GPSTIME_MULTI_MINUS)
        {
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 5);
        }
        else
        {
          gpstime_diff = ic_gpstime->decompress(LASZIP_GPSTIME_MULTI_MINUS*last_gpstime_diff[last], 6);
          multi_extreme_counter[last]++;
          if (multi_extreme_counter[last] > 3)
          {
            last_gpstime_diff[last] = gpstime_diff;
            multi_extreme_counter[last] = 0;
          }
        }
      }
      last_gpstime[last].i64 += gpstime_diff;
    }
    else if (multi ==  LASZIP_GPSTIME_MULTI_CODE_FULL)
    {
      next = (next+1)&3;
      last_gpstime[next].u64 = ic_gpstime->decompress((I32)(last_gpstime[last].u64 >> 32), 8);
      last_gpstime[next].u64 = last_gpstime[next].u64 << 32;
      last_gpstime[next].u64 |= dec->readInt();
      last = next;
      last_gpstime_diff[last] = 0;
      multi_extreme_counter[last] = 0; 
    }
    else if (multi >=  LASZIP_GPSTIME_MULTI_CODE_FULL)
    {
      last = (last+multi-LASZIP_GPSTIME_MULTI_CODE_FULL)&3;
      read(item, context);
    }
  }
  *((I64*)item) = last_gpstime[last].i64;
}